

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderIndexingTests.cpp
# Opt level: O0

int __thiscall
deqp::gles2::Functional::ShaderIndexingTests::init(ShaderIndexingTests *this,EVP_PKEY_CTX *ctx)

{
  DataType DVar1;
  ShaderType SVar2;
  Context *pCVar3;
  TestCaseGroup *pTVar4;
  char *pcVar5;
  char *pcVar6;
  ShaderIndexingCase *pSVar7;
  char *pcVar8;
  char *pcVar9;
  ulong extraout_RAX;
  ulong uVar10;
  allocator<char> local_949;
  undefined1 local_948 [6];
  bool isVertexCase_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_928;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_908;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8a8;
  undefined1 local_888 [8];
  string desc_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_860;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_840;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_820;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_800;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7c0;
  undefined1 local_7a0 [8];
  string name_4;
  char *shaderTypeName_3;
  ShaderType shaderType_3;
  int shaderTypeNdx_3;
  char *readAccessName_3;
  char *writeAccessName_2;
  int readAccess_3;
  int writeAccess_2;
  DataType varType_4;
  int typeNdx_4;
  TestCaseGroup *matGroup;
  undefined1 local_740 [6];
  bool isVertexCase_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_720;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_700;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6a0;
  undefined1 local_680 [8];
  string desc_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_658;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_638;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_618;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5b8;
  undefined1 local_598 [8];
  string name_3;
  char *shaderTypeName_2;
  ShaderType shaderType_2;
  int shaderTypeNdx_2;
  char *readAccessName_2;
  char *writeAccessName_1;
  int readAccess_2;
  int writeAccess_1;
  DataType varType_3;
  int typeNdx_3;
  TestCaseGroup *vecGroup;
  undefined1 local_538 [6];
  bool isVertexCase_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_518;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_498;
  undefined1 local_478 [8];
  string desc_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_430;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_410;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  undefined1 local_390 [8];
  string name_2;
  char *shaderTypeName_1;
  ShaderType shaderType_1;
  int shaderTypeNdx_1;
  char *readAccessName_1;
  char *writeAccessName;
  int readAccess_1;
  int writeAccess;
  DataType varType_2;
  int typeNdx_2;
  TestCaseGroup *tmpGroup;
  undefined1 local_330 [6];
  bool isVertexCase;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  undefined1 local_2b0 [8];
  string desc_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  undefined1 local_208 [8];
  string name_1;
  char *shaderTypeName;
  ShaderType shaderType;
  int shaderTypeNdx;
  char *readAccessName;
  int readAccess;
  DataType varType_1;
  int typeNdx_1;
  TestCaseGroup *uniformGroup;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  undefined1 local_130 [8];
  string desc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  undefined1 local_68 [8];
  string name;
  char *fragAccessName;
  char *vertAccessName;
  IndexAccessType local_30;
  int fragAccess;
  int vertAccess;
  DataType varType;
  int typeNdx;
  TestCaseGroup *varyingGroup;
  ShaderIndexingTests *this_local;
  
  pTVar4 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar4,(this->super_TestCaseGroup).m_context,"varying_array",
             "Varying array access tests.");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar4);
  for (vertAccess = 0; vertAccess < 4; vertAccess = vertAccess + 1) {
    DVar1 = init::s_floatAndVecTypes[vertAccess];
    for (local_30 = INDEXACCESS_STATIC; (int)local_30 < 4; local_30 = local_30 + INDEXACCESS_DYNAMIC
        ) {
      for (vertAccessName._4_4_ = INDEXACCESS_STATIC; (int)vertAccessName._4_4_ < 4;
          vertAccessName._4_4_ = vertAccessName._4_4_ + INDEXACCESS_DYNAMIC) {
        pcVar5 = getIndexAccessTypeName(local_30);
        name.field_2._8_8_ = getIndexAccessTypeName(vertAccessName._4_4_);
        pcVar6 = glu::getDataTypeName(DVar1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_108,pcVar6,(allocator<char> *)(desc.field_2._M_local_buf + 0xf))
        ;
        std::operator+(&local_e8,&local_108,"_");
        std::operator+(&local_c8,&local_e8,pcVar5);
        std::operator+(&local_a8,&local_c8,"_write_");
        std::operator+(&local_88,&local_a8,(char *)name.field_2._8_8_);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68
                       ,&local_88,"_read");
        std::__cxx11::string::~string((string *)&local_88);
        std::__cxx11::string::~string((string *)&local_a8);
        std::__cxx11::string::~string((string *)&local_c8);
        std::__cxx11::string::~string((string *)&local_e8);
        std::__cxx11::string::~string((string *)&local_108);
        std::allocator<char>::~allocator((allocator<char> *)(desc.field_2._M_local_buf + 0xf));
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1b0,"Varying array with ",
                   (allocator<char> *)((long)&uniformGroup + 7));
        std::operator+(&local_190,&local_1b0,pcVar5);
        std::operator+(&local_170,&local_190," write in vertex shader and ");
        std::operator+(&local_150,&local_170,(char *)name.field_2._8_8_);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_130,&local_150," read in fragment shader.");
        std::__cxx11::string::~string((string *)&local_150);
        std::__cxx11::string::~string((string *)&local_170);
        std::__cxx11::string::~string((string *)&local_190);
        std::__cxx11::string::~string((string *)&local_1b0);
        std::allocator<char>::~allocator((allocator<char> *)((long)&uniformGroup + 7));
        pCVar3 = (this->super_TestCaseGroup).m_context;
        pcVar5 = (char *)std::__cxx11::string::c_str();
        pcVar6 = (char *)std::__cxx11::string::c_str();
        pSVar7 = createVaryingArrayCase(pCVar3,pcVar5,pcVar6,DVar1,local_30,vertAccessName._4_4_);
        tcu::TestNode::addChild((TestNode *)pTVar4,(TestNode *)pSVar7);
        std::__cxx11::string::~string((string *)local_130);
        std::__cxx11::string::~string((string *)local_68);
      }
    }
  }
  pTVar4 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar4,(this->super_TestCaseGroup).m_context,"uniform_array",
             "Uniform array access tests.");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar4);
  for (readAccess = 0; readAccess < 4; readAccess = readAccess + 1) {
    DVar1 = init::s_floatAndVecTypes[readAccess];
    for (readAccessName._4_4_ = INDEXACCESS_STATIC; (int)readAccessName._4_4_ < 4;
        readAccessName._4_4_ = readAccessName._4_4_ + INDEXACCESS_DYNAMIC) {
      pcVar5 = getIndexAccessTypeName(readAccessName._4_4_);
      for (shaderTypeName._4_4_ = 0; shaderTypeName._4_4_ < 2;
          shaderTypeName._4_4_ = shaderTypeName._4_4_ + 1) {
        SVar2 = init::s_shaderTypes[shaderTypeName._4_4_];
        name_1.field_2._8_8_ = glu::getShaderTypeName(SVar2);
        pcVar6 = glu::getDataTypeName(DVar1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_288,pcVar6,
                   (allocator<char> *)(desc_1.field_2._M_local_buf + 0xf));
        std::operator+(&local_268,&local_288,"_");
        std::operator+(&local_248,&local_268,pcVar5);
        std::operator+(&local_228,&local_248,"_read_");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_208,&local_228,(char *)name_1.field_2._8_8_);
        std::__cxx11::string::~string((string *)&local_228);
        std::__cxx11::string::~string((string *)&local_248);
        std::__cxx11::string::~string((string *)&local_268);
        std::__cxx11::string::~string((string *)&local_288);
        std::allocator<char>::~allocator((allocator<char> *)(desc_1.field_2._M_local_buf + 0xf));
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_330,"Uniform array with ",
                   (allocator<char> *)((long)&tmpGroup + 7));
        std::operator+(&local_310,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_330,pcVar5);
        std::operator+(&local_2f0,&local_310," read in ");
        std::operator+(&local_2d0,&local_2f0,(char *)name_1.field_2._8_8_);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_2b0,&local_2d0," shader.");
        std::__cxx11::string::~string((string *)&local_2d0);
        std::__cxx11::string::~string((string *)&local_2f0);
        std::__cxx11::string::~string((string *)&local_310);
        std::__cxx11::string::~string((string *)local_330);
        std::allocator<char>::~allocator((allocator<char> *)((long)&tmpGroup + 7));
        tmpGroup._6_1_ = SVar2 == SHADERTYPE_VERTEX;
        pCVar3 = (this->super_TestCaseGroup).m_context;
        pcVar6 = (char *)std::__cxx11::string::c_str();
        pcVar8 = (char *)std::__cxx11::string::c_str();
        pSVar7 = createUniformArrayCase
                           (pCVar3,pcVar6,pcVar8,(bool)(tmpGroup._6_1_ & 1),DVar1,
                            readAccessName._4_4_);
        tcu::TestNode::addChild((TestNode *)pTVar4,(TestNode *)pSVar7);
        std::__cxx11::string::~string((string *)local_2b0);
        std::__cxx11::string::~string((string *)local_208);
      }
    }
  }
  pTVar4 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar4,(this->super_TestCaseGroup).m_context,"tmp_array",
             "Temporary array access tests.");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar4);
  for (writeAccess = 0; writeAccess < 4; writeAccess = writeAccess + 1) {
    DVar1 = init::s_floatAndVecTypes[writeAccess];
    for (writeAccessName._4_4_ = INDEXACCESS_STATIC; (int)writeAccessName._4_4_ < 4;
        writeAccessName._4_4_ = writeAccessName._4_4_ + INDEXACCESS_DYNAMIC) {
      for (writeAccessName._0_4_ = INDEXACCESS_STATIC; (int)(IndexAccessType)writeAccessName < 4;
          writeAccessName._0_4_ = (IndexAccessType)writeAccessName + INDEXACCESS_DYNAMIC) {
        pcVar5 = getIndexAccessTypeName(writeAccessName._4_4_);
        pcVar6 = getIndexAccessTypeName((IndexAccessType)writeAccessName);
        for (shaderTypeName_1._4_4_ = 0; shaderTypeName_1._4_4_ < 2;
            shaderTypeName_1._4_4_ = shaderTypeName_1._4_4_ + 1) {
          SVar2 = init::s_shaderTypes[shaderTypeName_1._4_4_];
          name_2.field_2._8_8_ = glu::getShaderTypeName(SVar2);
          pcVar8 = glu::getDataTypeName(DVar1);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_450,pcVar8,
                     (allocator<char> *)(desc_2.field_2._M_local_buf + 0xf));
          std::operator+(&local_430,&local_450,"_");
          std::operator+(&local_410,&local_430,pcVar5);
          std::operator+(&local_3f0,&local_410,"_write_");
          std::operator+(&local_3d0,&local_3f0,pcVar6);
          std::operator+(&local_3b0,&local_3d0,"_read_");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_390,&local_3b0,(char *)name_2.field_2._8_8_);
          std::__cxx11::string::~string((string *)&local_3b0);
          std::__cxx11::string::~string((string *)&local_3d0);
          std::__cxx11::string::~string((string *)&local_3f0);
          std::__cxx11::string::~string((string *)&local_410);
          std::__cxx11::string::~string((string *)&local_430);
          std::__cxx11::string::~string((string *)&local_450);
          std::allocator<char>::~allocator((allocator<char> *)(desc_2.field_2._M_local_buf + 0xf));
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_538,"Temporary array with ",
                     (allocator<char> *)((long)&vecGroup + 7));
          std::operator+(&local_518,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_538,pcVar5);
          std::operator+(&local_4f8,&local_518," write and ");
          std::operator+(&local_4d8,&local_4f8,pcVar6);
          std::operator+(&local_4b8,&local_4d8," read in ");
          std::operator+(&local_498,&local_4b8,(char *)name_2.field_2._8_8_);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_478,&local_498," shader.");
          std::__cxx11::string::~string((string *)&local_498);
          std::__cxx11::string::~string((string *)&local_4b8);
          std::__cxx11::string::~string((string *)&local_4d8);
          std::__cxx11::string::~string((string *)&local_4f8);
          std::__cxx11::string::~string((string *)&local_518);
          std::__cxx11::string::~string((string *)local_538);
          std::allocator<char>::~allocator((allocator<char> *)((long)&vecGroup + 7));
          vecGroup._6_1_ = SVar2 == SHADERTYPE_VERTEX;
          pCVar3 = (this->super_TestCaseGroup).m_context;
          pcVar8 = (char *)std::__cxx11::string::c_str();
          pcVar9 = (char *)std::__cxx11::string::c_str();
          pSVar7 = createTmpArrayCase(pCVar3,pcVar8,pcVar9,(bool)(vecGroup._6_1_ & 1),DVar1,
                                      writeAccessName._4_4_,(IndexAccessType)writeAccessName);
          tcu::TestNode::addChild((TestNode *)pTVar4,(TestNode *)pSVar7);
          std::__cxx11::string::~string((string *)local_478);
          std::__cxx11::string::~string((string *)local_390);
        }
      }
    }
  }
  pTVar4 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar4,(this->super_TestCaseGroup).m_context,"vector_subscript",
             "Vector subscript indexing.");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar4);
  for (writeAccess_1 = 0; writeAccess_1 < 3; writeAccess_1 = writeAccess_1 + 1) {
    DVar1 = init::s_vectorTypes[writeAccess_1];
    for (writeAccessName_1._4_4_ = DIRECT; (int)writeAccessName_1._4_4_ < 6;
        writeAccessName_1._4_4_ = writeAccessName_1._4_4_ + COMPONENT) {
      for (writeAccessName_1._0_4_ = DIRECT; (int)(VectorAccessType)writeAccessName_1 < 6;
          writeAccessName_1._0_4_ = (VectorAccessType)writeAccessName_1 + COMPONENT) {
        pcVar5 = getVectorAccessTypeName(writeAccessName_1._4_4_);
        pcVar6 = getVectorAccessTypeName((VectorAccessType)writeAccessName_1);
        for (shaderTypeName_2._4_4_ = 0; shaderTypeName_2._4_4_ < 2;
            shaderTypeName_2._4_4_ = shaderTypeName_2._4_4_ + 1) {
          SVar2 = init::s_shaderTypes[shaderTypeName_2._4_4_];
          name_3.field_2._8_8_ = glu::getShaderTypeName(SVar2);
          pcVar8 = glu::getDataTypeName(DVar1);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_658,pcVar8,
                     (allocator<char> *)(desc_3.field_2._M_local_buf + 0xf));
          std::operator+(&local_638,&local_658,"_");
          std::operator+(&local_618,&local_638,pcVar5);
          std::operator+(&local_5f8,&local_618,"_write_");
          std::operator+(&local_5d8,&local_5f8,pcVar6);
          std::operator+(&local_5b8,&local_5d8,"_read_");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_598,&local_5b8,(char *)name_3.field_2._8_8_);
          std::__cxx11::string::~string((string *)&local_5b8);
          std::__cxx11::string::~string((string *)&local_5d8);
          std::__cxx11::string::~string((string *)&local_5f8);
          std::__cxx11::string::~string((string *)&local_618);
          std::__cxx11::string::~string((string *)&local_638);
          std::__cxx11::string::~string((string *)&local_658);
          std::allocator<char>::~allocator((allocator<char> *)(desc_3.field_2._M_local_buf + 0xf));
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_740,"Vector subscript access with ",
                     (allocator<char> *)((long)&matGroup + 7));
          std::operator+(&local_720,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_740,pcVar5);
          std::operator+(&local_700,&local_720," write and ");
          std::operator+(&local_6e0,&local_700,pcVar6);
          std::operator+(&local_6c0,&local_6e0," read in ");
          std::operator+(&local_6a0,&local_6c0,(char *)name_3.field_2._8_8_);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_680,&local_6a0," shader.");
          std::__cxx11::string::~string((string *)&local_6a0);
          std::__cxx11::string::~string((string *)&local_6c0);
          std::__cxx11::string::~string((string *)&local_6e0);
          std::__cxx11::string::~string((string *)&local_700);
          std::__cxx11::string::~string((string *)&local_720);
          std::__cxx11::string::~string((string *)local_740);
          std::allocator<char>::~allocator((allocator<char> *)((long)&matGroup + 7));
          matGroup._6_1_ = SVar2 == SHADERTYPE_VERTEX;
          pCVar3 = (this->super_TestCaseGroup).m_context;
          pcVar8 = (char *)std::__cxx11::string::c_str();
          pcVar9 = (char *)std::__cxx11::string::c_str();
          pSVar7 = createVectorSubscriptCase
                             (pCVar3,pcVar8,pcVar9,(bool)(matGroup._6_1_ & 1),DVar1,
                              writeAccessName_1._4_4_,(VectorAccessType)writeAccessName_1);
          tcu::TestNode::addChild((TestNode *)pTVar4,(TestNode *)pSVar7);
          std::__cxx11::string::~string((string *)local_680);
          std::__cxx11::string::~string((string *)local_598);
        }
      }
    }
  }
  pTVar4 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar4,(this->super_TestCaseGroup).m_context,"matrix_subscript",
             "Matrix subscript indexing.");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar4);
  writeAccess_2 = 0;
  uVar10 = extraout_RAX;
  while (writeAccess_2 < 3) {
    DVar1 = init::s_matrixTypes[writeAccess_2];
    for (writeAccessName_2._4_4_ = INDEXACCESS_STATIC; (int)writeAccessName_2._4_4_ < 4;
        writeAccessName_2._4_4_ = writeAccessName_2._4_4_ + INDEXACCESS_DYNAMIC) {
      for (writeAccessName_2._0_4_ = INDEXACCESS_STATIC; (int)(IndexAccessType)writeAccessName_2 < 4
          ; writeAccessName_2._0_4_ = (IndexAccessType)writeAccessName_2 + INDEXACCESS_DYNAMIC) {
        pcVar5 = getIndexAccessTypeName(writeAccessName_2._4_4_);
        pcVar6 = getIndexAccessTypeName((IndexAccessType)writeAccessName_2);
        for (shaderTypeName_3._4_4_ = 0; shaderTypeName_3._4_4_ < 2;
            shaderTypeName_3._4_4_ = shaderTypeName_3._4_4_ + 1) {
          SVar2 = init::s_shaderTypes[shaderTypeName_3._4_4_];
          name_4.field_2._8_8_ = glu::getShaderTypeName(SVar2);
          pcVar8 = glu::getDataTypeName(DVar1);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_860,pcVar8,
                     (allocator<char> *)(desc_4.field_2._M_local_buf + 0xf));
          std::operator+(&local_840,&local_860,"_");
          std::operator+(&local_820,&local_840,pcVar5);
          std::operator+(&local_800,&local_820,"_write_");
          std::operator+(&local_7e0,&local_800,pcVar6);
          std::operator+(&local_7c0,&local_7e0,"_read_");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_7a0,&local_7c0,(char *)name_4.field_2._8_8_);
          std::__cxx11::string::~string((string *)&local_7c0);
          std::__cxx11::string::~string((string *)&local_7e0);
          std::__cxx11::string::~string((string *)&local_800);
          std::__cxx11::string::~string((string *)&local_820);
          std::__cxx11::string::~string((string *)&local_840);
          std::__cxx11::string::~string((string *)&local_860);
          std::allocator<char>::~allocator((allocator<char> *)(desc_4.field_2._M_local_buf + 0xf));
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_948,"Vector subscript access with ",&local_949);
          std::operator+(&local_928,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_948,pcVar5);
          std::operator+(&local_908,&local_928," write and ");
          std::operator+(&local_8e8,&local_908,pcVar6);
          std::operator+(&local_8c8,&local_8e8," read in ");
          std::operator+(&local_8a8,&local_8c8,(char *)name_4.field_2._8_8_);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_888,&local_8a8," shader.");
          std::__cxx11::string::~string((string *)&local_8a8);
          std::__cxx11::string::~string((string *)&local_8c8);
          std::__cxx11::string::~string((string *)&local_8e8);
          std::__cxx11::string::~string((string *)&local_908);
          std::__cxx11::string::~string((string *)&local_928);
          std::__cxx11::string::~string((string *)local_948);
          std::allocator<char>::~allocator(&local_949);
          pCVar3 = (this->super_TestCaseGroup).m_context;
          pcVar8 = (char *)std::__cxx11::string::c_str();
          pcVar9 = (char *)std::__cxx11::string::c_str();
          pSVar7 = createMatrixSubscriptCase
                             (pCVar3,pcVar8,pcVar9,SVar2 == SHADERTYPE_VERTEX,DVar1,
                              writeAccessName_2._4_4_,(IndexAccessType)writeAccessName_2);
          tcu::TestNode::addChild((TestNode *)pTVar4,(TestNode *)pSVar7);
          std::__cxx11::string::~string((string *)local_888);
          std::__cxx11::string::~string((string *)local_7a0);
        }
      }
    }
    writeAccess_2 = writeAccess_2 + 1;
    uVar10 = (ulong)(uint)writeAccess_2;
  }
  return (int)uVar10;
}

Assistant:

void ShaderIndexingTests::init (void)
{
	static const ShaderType s_shaderTypes[] =
	{
		SHADERTYPE_VERTEX,
		SHADERTYPE_FRAGMENT
	};

	static const DataType s_floatAndVecTypes[] =
	{
		TYPE_FLOAT,
		TYPE_FLOAT_VEC2,
		TYPE_FLOAT_VEC3,
		TYPE_FLOAT_VEC4
	};

	// Varying array access cases.
	{
		TestCaseGroup* varyingGroup = new TestCaseGroup(m_context, "varying_array", "Varying array access tests.");
		addChild(varyingGroup);

		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(s_floatAndVecTypes); typeNdx++)
		{
			DataType varType = s_floatAndVecTypes[typeNdx];
			for (int vertAccess = 0; vertAccess < INDEXACCESS_LAST; vertAccess++)
			{
				for (int fragAccess = 0; fragAccess < INDEXACCESS_LAST; fragAccess++)
				{
					const char* vertAccessName = getIndexAccessTypeName((IndexAccessType)vertAccess);
					const char* fragAccessName = getIndexAccessTypeName((IndexAccessType)fragAccess);
					string name = string(getDataTypeName(varType)) + "_" + vertAccessName + "_write_" + fragAccessName + "_read";
					string desc = string("Varying array with ") + vertAccessName + " write in vertex shader and " + fragAccessName + " read in fragment shader.";
					varyingGroup->addChild(createVaryingArrayCase(m_context, name.c_str(), desc.c_str(), varType, (IndexAccessType)vertAccess, (IndexAccessType)fragAccess));
				}
			}
		}
	}

	// Uniform array access cases.
	{
		TestCaseGroup* uniformGroup = new TestCaseGroup(m_context, "uniform_array", "Uniform array access tests.");
		addChild(uniformGroup);

		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(s_floatAndVecTypes); typeNdx++)
		{
			DataType varType = s_floatAndVecTypes[typeNdx];
			for (int readAccess = 0; readAccess < INDEXACCESS_LAST; readAccess++)
			{
				const char* readAccessName = getIndexAccessTypeName((IndexAccessType)readAccess);
				for (int shaderTypeNdx = 0; shaderTypeNdx < DE_LENGTH_OF_ARRAY(s_shaderTypes); shaderTypeNdx++)
				{
					ShaderType	shaderType		= s_shaderTypes[shaderTypeNdx];
					const char*	shaderTypeName	= getShaderTypeName(shaderType);
					string		name			= string(getDataTypeName(varType)) + "_" + readAccessName + "_read_" + shaderTypeName;
					string		desc			= string("Uniform array with ") + readAccessName + " read in " + shaderTypeName + " shader.";
					bool isVertexCase = ((ShaderType)shaderType == SHADERTYPE_VERTEX);
					uniformGroup->addChild(createUniformArrayCase(m_context, name.c_str(), desc.c_str(), isVertexCase, varType, (IndexAccessType)readAccess));
				}
			}
		}
	}

	// Temporary array access cases.
	{
		TestCaseGroup* tmpGroup = new TestCaseGroup(m_context, "tmp_array", "Temporary array access tests.");
		addChild(tmpGroup);

		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(s_floatAndVecTypes); typeNdx++)
		{
			DataType varType = s_floatAndVecTypes[typeNdx];
			for (int writeAccess = 0; writeAccess < INDEXACCESS_LAST; writeAccess++)
			{
				for (int readAccess = 0; readAccess < INDEXACCESS_LAST; readAccess++)
				{
					const char* writeAccessName = getIndexAccessTypeName((IndexAccessType)writeAccess);
					const char* readAccessName = getIndexAccessTypeName((IndexAccessType)readAccess);

					for (int shaderTypeNdx = 0; shaderTypeNdx < DE_LENGTH_OF_ARRAY(s_shaderTypes); shaderTypeNdx++)
					{
						ShaderType	shaderType		= s_shaderTypes[shaderTypeNdx];
						const char* shaderTypeName	= getShaderTypeName(shaderType);
						string		name			= string(getDataTypeName(varType)) + "_" + writeAccessName + "_write_" + readAccessName + "_read_" + shaderTypeName;
						string		desc			= string("Temporary array with ") + writeAccessName + " write and " + readAccessName + " read in " + shaderTypeName + " shader.";
						bool		isVertexCase	= ((ShaderType)shaderType == SHADERTYPE_VERTEX);
						tmpGroup->addChild(createTmpArrayCase(m_context, name.c_str(), desc.c_str(), isVertexCase, varType, (IndexAccessType)writeAccess, (IndexAccessType)readAccess));
					}
				}
			}
		}
	}

	// Vector indexing with subscripts.
	{
		TestCaseGroup* vecGroup = new TestCaseGroup(m_context, "vector_subscript", "Vector subscript indexing.");
		addChild(vecGroup);

		static const DataType s_vectorTypes[] =
		{
			TYPE_FLOAT_VEC2,
			TYPE_FLOAT_VEC3,
			TYPE_FLOAT_VEC4
		};

		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(s_vectorTypes); typeNdx++)
		{
			DataType varType = s_vectorTypes[typeNdx];
			for (int writeAccess = 0; writeAccess < VECTORACCESS_LAST; writeAccess++)
			{
				for (int readAccess = 0; readAccess < VECTORACCESS_LAST; readAccess++)
				{
					const char* writeAccessName = getVectorAccessTypeName((VectorAccessType)writeAccess);
					const char* readAccessName = getVectorAccessTypeName((VectorAccessType)readAccess);

					for (int shaderTypeNdx = 0; shaderTypeNdx < DE_LENGTH_OF_ARRAY(s_shaderTypes); shaderTypeNdx++)
					{
						ShaderType	shaderType		= s_shaderTypes[shaderTypeNdx];
						const char* shaderTypeName	= getShaderTypeName(shaderType);
						string		name			= string(getDataTypeName(varType)) + "_" + writeAccessName + "_write_" + readAccessName + "_read_" + shaderTypeName;
						string		desc			= string("Vector subscript access with ") + writeAccessName + " write and " + readAccessName + " read in " + shaderTypeName + " shader.";
						bool		isVertexCase	= ((ShaderType)shaderType == SHADERTYPE_VERTEX);
						vecGroup->addChild(createVectorSubscriptCase(m_context, name.c_str(), desc.c_str(), isVertexCase, varType, (VectorAccessType)writeAccess, (VectorAccessType)readAccess));
					}
				}
			}
		}
	}

	// Matrix indexing with subscripts.
	{
		TestCaseGroup* matGroup = new TestCaseGroup(m_context, "matrix_subscript", "Matrix subscript indexing.");
		addChild(matGroup);

		static const DataType s_matrixTypes[] =
		{
			TYPE_FLOAT_MAT2,
			TYPE_FLOAT_MAT3,
			TYPE_FLOAT_MAT4
		};

		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(s_matrixTypes); typeNdx++)
		{
			DataType varType = s_matrixTypes[typeNdx];
			for (int writeAccess = 0; writeAccess < INDEXACCESS_LAST; writeAccess++)
			{
				for (int readAccess = 0; readAccess < INDEXACCESS_LAST; readAccess++)
				{
					const char* writeAccessName = getIndexAccessTypeName((IndexAccessType)writeAccess);
					const char* readAccessName = getIndexAccessTypeName((IndexAccessType)readAccess);

					for (int shaderTypeNdx = 0; shaderTypeNdx < DE_LENGTH_OF_ARRAY(s_shaderTypes); shaderTypeNdx++)
					{
						ShaderType	shaderType		= s_shaderTypes[shaderTypeNdx];
						const char* shaderTypeName	= getShaderTypeName(shaderType);
						string		name			= string(getDataTypeName(varType)) + "_" + writeAccessName + "_write_" + readAccessName + "_read_" + shaderTypeName;
						string		desc			= string("Vector subscript access with ") + writeAccessName + " write and " + readAccessName + " read in " + shaderTypeName + " shader.";
						bool		isVertexCase	= ((ShaderType)shaderType == SHADERTYPE_VERTEX);
						matGroup->addChild(createMatrixSubscriptCase(m_context, name.c_str(), desc.c_str(), isVertexCase, varType, (IndexAccessType)writeAccess, (IndexAccessType)readAccess));
					}
				}
			}
		}
	}
}